

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  uint uVar1;
  Message *pMVar2;
  undefined7 in_register_00000011;
  size_t sVar3;
  String SVar4;
  Message msg;
  String local_30;
  Int32 shard_index;
  Int32 total_shards;
  
  if ((int)CONCAT71(in_register_00000011,in_subprocess_for_death_test) == 0) {
    uVar1 = Int32FromEnvOrDie(total_shards_env,-1);
    total_shards = uVar1;
    shard_index = Int32FromEnvOrDie(shard_index_env,-1);
    if ((uVar1 & shard_index) != 0xffffffff) {
      if (shard_index == 0xffffffff || uVar1 != 0xffffffff) {
        if (uVar1 == 0xffffffff || shard_index != 0xffffffff) {
          if ((-1 < shard_index) && (shard_index < (int)uVar1)) {
            return 1 < (int)uVar1;
          }
          Message::Message((Message *)&local_30);
          pMVar2 = Message::operator<<((Message *)&local_30,
                                       (char (*) [48])
                                       "Invalid environment variables: we require 0 <= ");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [18])"GTEST_SHARD_INDEX");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [4])" < ");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [19])"GTEST_TOTAL_SHARDS");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [16])", but you have ");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [18])"GTEST_SHARD_INDEX");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x131a00);
          pMVar2 = Message::operator<<(pMVar2,&shard_index);
          pMVar2 = Message::operator<<(pMVar2,(char (*) [3])0x131e4b);
          pMVar2 = Message::operator<<(pMVar2,(char (*) [19])"GTEST_TOTAL_SHARDS");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x131a00);
          pMVar2 = Message::operator<<(pMVar2,&total_shards);
          pMVar2 = Message::operator<<(pMVar2,(char (*) [3])0x13091e);
          Message::Message(&msg,pMVar2);
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_30);
          SVar4 = StringStreamToString((internal *)&local_30,(stringstream *)msg.ss_.ptr_);
          sVar3 = SVar4.length_;
        }
        else {
          Message::Message((Message *)&local_30);
          pMVar2 = Message::operator<<((Message *)&local_30,
                                       (char (*) [41])"Invalid environment variables: you have ");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [19])"GTEST_TOTAL_SHARDS");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [4])" = ");
          pMVar2 = Message::operator<<(pMVar2,&total_shards);
          pMVar2 = Message::operator<<(pMVar2,(char (*) [17])", but have left ");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [18])"GTEST_SHARD_INDEX");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [9])" unset.\n");
          Message::Message(&msg,pMVar2);
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_30);
          SVar4 = StringStreamToString((internal *)&local_30,(stringstream *)msg.ss_.ptr_);
          sVar3 = SVar4.length_;
        }
      }
      else {
        Message::Message((Message *)&local_30);
        pMVar2 = Message::operator<<((Message *)&local_30,
                                     (char (*) [41])"Invalid environment variables: you have ");
        pMVar2 = Message::operator<<(pMVar2,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar2 = Message::operator<<(pMVar2,(char (*) [4])" = ");
        pMVar2 = Message::operator<<(pMVar2,&shard_index);
        pMVar2 = Message::operator<<(pMVar2,(char (*) [17])", but have left ");
        pMVar2 = Message::operator<<(pMVar2,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar2 = Message::operator<<(pMVar2,(char (*) [9])" unset.\n");
        Message::Message(&msg,pMVar2);
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_30);
        SVar4 = StringStreamToString((internal *)&local_30,(stringstream *)msg.ss_.ptr_);
        sVar3 = SVar4.length_;
      }
      ColoredPrintf(COLOR_RED,local_30.c_str_,sVar3);
      String::~String(&local_30);
      fflush(_stdout);
      exit(1);
    }
  }
  return false;
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}